

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int findLeafNode(Rtree *pRtree,i64 iRowid,RtreeNode **ppLeaf,sqlite3_int64 *piNode)

{
  int iVar1;
  sqlite3_int64 iNode_00;
  i64 iNode;
  int rc;
  sqlite3_int64 *piNode_local;
  RtreeNode **ppLeaf_local;
  i64 iRowid_local;
  Rtree *pRtree_local;
  
  *ppLeaf = (RtreeNode *)0x0;
  sqlite3_bind_int64(pRtree->pReadRowid,1,iRowid);
  iVar1 = sqlite3_step(pRtree->pReadRowid);
  if (iVar1 == 100) {
    iNode_00 = sqlite3_column_int64(pRtree->pReadRowid,0);
    if (piNode != (sqlite3_int64 *)0x0) {
      *piNode = iNode_00;
    }
    iNode._4_4_ = nodeAcquire(pRtree,iNode_00,(RtreeNode *)0x0,ppLeaf);
    sqlite3_reset(pRtree->pReadRowid);
  }
  else {
    iNode._4_4_ = sqlite3_reset(pRtree->pReadRowid);
  }
  return iNode._4_4_;
}

Assistant:

static int findLeafNode(
  Rtree *pRtree,              /* RTree to search */
  i64 iRowid,                 /* The rowid searching for */
  RtreeNode **ppLeaf,         /* Write the node here */
  sqlite3_int64 *piNode       /* Write the node-id here */
){
  int rc;
  *ppLeaf = 0;
  sqlite3_bind_int64(pRtree->pReadRowid, 1, iRowid);
  if( sqlite3_step(pRtree->pReadRowid)==SQLITE_ROW ){
    i64 iNode = sqlite3_column_int64(pRtree->pReadRowid, 0);
    if( piNode ) *piNode = iNode;
    rc = nodeAcquire(pRtree, iNode, 0, ppLeaf);
    sqlite3_reset(pRtree->pReadRowid);
  }else{
    rc = sqlite3_reset(pRtree->pReadRowid);
  }
  return rc;
}